

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

void __thiscall flatbuffers::ts::TsGenerator::generateStructs(TsGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parser *pPVar2;
  long *plVar3;
  long *plVar4;
  ulong *puVar5;
  StructDef *struct_def;
  pointer ppSVar6;
  string type_name;
  import_set imports;
  import_set bare_imports;
  string declcode;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8 [2];
  long local_2d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  IdlNamer *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  undefined1 local_270 [32];
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  Definition *local_1b0;
  Definition *pDStack_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  import_set local_180;
  import_set local_150;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_120;
  
  pPVar2 = (this->super_BaseGenerator).parser_;
  ppSVar6 = (pPVar2->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar6 !=
      (pPVar2->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_280 = &local_120.second.rel_file_path.field_2;
    local_278 = &local_120.second.bare_file_path.field_2;
    local_288 = &this->namer_;
    do {
      local_150._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_150._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_150._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_150._M_t._M_impl.super__Rb_tree_header._M_header;
      local_150._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_180._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_180._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_180._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_180._M_t._M_impl.super__Rb_tree_header._M_header;
      local_180._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      local_180._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_180._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_150._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_150._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"* as flatbuffers","");
      local_2e8[0] = local_2d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"flatbuffers","");
      local_270._0_8_ = local_270 + 0x10;
      local_270._8_8_ = 0;
      local_270[0x10] = '\0';
      local_250._M_p = (pointer)&local_240;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      local_230._M_p = (pointer)&local_220;
      local_228 = 0;
      local_220._M_local_buf[0] = '\0';
      local_210._M_p = (pointer)&local_200;
      local_208 = 0;
      local_200._M_local_buf[0] = '\0';
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      local_1c8 = 0;
      local_1c0._M_local_buf[0] = '\0';
      local_1b0 = (Definition *)0x0;
      pDStack_1a8 = (Definition *)0x0;
      local_1f0._M_p = (pointer)&local_1e0;
      local_1d0._M_p = (pointer)&local_1c0;
      std::__cxx11::string::_M_assign((string *)local_270);
      std::operator+(&local_1a0,"import ",&local_2c8);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      local_328 = &local_318;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_318 = *plVar4;
        lStack_310 = plVar3[3];
      }
      else {
        local_318 = *plVar4;
        local_328 = (long *)*plVar3;
      }
      local_320 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_2e8[0]);
      local_308 = &local_2f8;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_2f8 = *plVar4;
        lStack_2f0 = plVar3[3];
      }
      else {
        local_2f8 = *plVar4;
        local_308 = (long *)*plVar3;
      }
      local_300 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_308);
      paVar1 = &local_120.first.field_2;
      puVar5 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_120.first.field_2._M_allocated_capacity = *puVar5;
        local_120.first.field_2._8_8_ = plVar3[3];
        local_120.first._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_120.first.field_2._M_allocated_capacity = *puVar5;
        local_120.first._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_120.first._M_string_length = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_250,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_120.first._M_dataplus._M_p,
                        local_120.first.field_2._M_allocated_capacity + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      local_120.first._M_dataplus._M_p = (pointer)&local_120.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,local_2c8._M_dataplus._M_p,
                 local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
      anon_unknown_10::ImportDefinition::ImportDefinition
                (&local_120.second,(ImportDefinition *)local_270);
      std::
      map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
      ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
                ((map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
                  *)&local_150,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.second.object_name._M_dataplus._M_p != &local_120.second.object_name.field_2)
      {
        operator_delete(local_120.second.object_name._M_dataplus._M_p,
                        local_120.second.object_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.second.rel_file_path._M_dataplus._M_p != local_280) {
        operator_delete(local_120.second.rel_file_path._M_dataplus._M_p,
                        local_120.second.rel_file_path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.second.bare_file_path._M_dataplus._M_p != local_278) {
        operator_delete(local_120.second.bare_file_path._M_dataplus._M_p,
                        local_120.second.bare_file_path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.second.export_statement._M_dataplus._M_p !=
          &local_120.second.export_statement.field_2) {
        operator_delete(local_120.second.export_statement._M_dataplus._M_p,
                        local_120.second.export_statement.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.second.import_statement._M_dataplus._M_p !=
          &local_120.second.import_statement.field_2) {
        operator_delete(local_120.second.import_statement._M_dataplus._M_p,
                        local_120.second.import_statement.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.second.name._M_dataplus._M_p != &local_120.second.name.field_2) {
        operator_delete(local_120.second.name._M_dataplus._M_p,
                        local_120.second.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.first._M_dataplus._M_p != &local_120.first.field_2) {
        operator_delete(local_120.first._M_dataplus._M_p,
                        local_120.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_p != &local_1c0) {
        operator_delete(local_1d0._M_p,
                        CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,
                        CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != &local_200) {
        operator_delete(local_210._M_p,
                        CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != &local_220) {
        operator_delete(local_230._M_p,
                        CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_p != &local_240) {
        operator_delete(local_250._M_p,
                        CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
      }
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0],local_2d8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      struct_def = *ppSVar6;
      local_120.first._M_dataplus._M_p = (pointer)&local_120.first.field_2;
      local_120.first._M_string_length = 0;
      local_120.first.field_2._M_allocated_capacity =
           local_120.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      GenStruct(this,(this->super_BaseGenerator).parser_,struct_def,&local_120.first,&local_180);
      (*(local_288->super_Namer)._vptr_Namer[0xf])(local_270,local_288,struct_def);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,local_270._0_8_,(pointer)(local_270._0_8_ + local_270._8_8_));
      TrackNsDef(this,&struct_def->super_Definition,&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      SaveType(this,&struct_def->super_Definition,&local_120.first,&local_180,&local_150);
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        struct_def = (StructDef *)(CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
        operator_delete((void *)local_270._0_8_,(ulong)struct_def);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.first._M_dataplus._M_p != &local_120.first.field_2) {
        struct_def = (StructDef *)(local_120.first.field_2._M_allocated_capacity + 1);
        operator_delete(local_120.first._M_dataplus._M_p,(ulong)struct_def);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
                  *)local_180._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Link_type)struct_def);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
                  *)local_150._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Link_type)struct_def);
      ppSVar6 = ppSVar6 + 1;
    } while (ppSVar6 !=
             (((this->super_BaseGenerator).parser_)->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void generateStructs() {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      import_set bare_imports;
      import_set imports;
      AddImport(bare_imports, "* as flatbuffers", "flatbuffers");
      auto &struct_def = **it;
      std::string declcode;
      GenStruct(parser_, struct_def, &declcode, imports);
      std::string type_name = GetTypeName(struct_def);
      TrackNsDef(struct_def, type_name);
      SaveType(struct_def, declcode, imports, bare_imports);
    }
  }